

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O2

int separatorMoveHelper(QList<QLayoutStruct> *list,int index,int delta,int sep)

{
  int iVar1;
  int iVar2;
  QLayoutStruct *pQVar3;
  int *piVar4;
  pointer pQVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  bool bVar10;
  int iVar11;
  long lVar12;
  int i_2;
  int iVar13;
  ulong uVar14;
  int i;
  int local_54;
  long local_50;
  
  uVar14 = (ulong)(uint)index;
  pQVar3 = (list->d).ptr;
  lVar12 = (list->d).size;
  iVar7 = 0;
  lVar9 = -0x20;
  do {
    lVar8 = lVar9;
    if (lVar12 << 5 == lVar8 + 0x20) {
      return 0;
    }
    lVar9 = lVar8 + 0x20;
  } while ((&pQVar3[1].empty)[lVar8] != false);
  local_54 = *(int *)((long)&pQVar3[1].pos + lVar8);
  if (local_54 != -1) {
    if (delta < 1) {
      iVar7 = 0;
      if (delta < 0) {
        lVar8 = (long)(index + 1);
        piVar4 = &pQVar3[lVar8].size;
        iVar7 = 0;
        for (lVar9 = lVar8; lVar9 < lVar12; lVar9 = lVar9 + 1) {
          if (*(bool *)((long)piVar4 + -7) == false) {
            if (piVar4[-5] == 0x7ffff) {
              iVar7 = 0x7ffff;
              break;
            }
            iVar7 = (piVar4[-5] + iVar7) - *piVar4;
          }
          piVar4 = piVar4 + 8;
        }
        iVar6 = -iVar7;
        if (SBORROW4(iVar7,-delta) == iVar7 + delta < 0) {
          iVar6 = delta;
        }
        iVar11 = 0;
        for (; (SBORROW4(iVar11,-iVar6) != iVar11 + iVar6 < 0 && (-1 < (int)uVar14));
            uVar14 = (ulong)((int)uVar14 - 1)) {
          pQVar5 = QList<QLayoutStruct>::data(list);
          iVar7 = 0;
          if (pQVar5[uVar14].empty == false) {
            iVar7 = pQVar5[uVar14].size;
            iVar13 = iVar11 + iVar6 + iVar7;
            if (iVar13 <= pQVar5[uVar14].minimumSize) {
              iVar13 = pQVar5[uVar14].minimumSize;
            }
            pQVar5[uVar14].size = iVar13;
            iVar7 = iVar7 - iVar13;
          }
          iVar11 = iVar11 + iVar7;
        }
        iVar7 = -iVar11;
        local_50 = lVar8 * 0x20 + 0x1c;
        iVar6 = 0;
        for (; (iVar11 - iVar6 != 0 && iVar6 <= iVar11 && (lVar8 < (list->d).size));
            lVar8 = lVar8 + 1) {
          pQVar5 = QList<QLayoutStruct>::data(list);
          iVar13 = 0;
          if (*(char *)((long)pQVar5 + local_50 + -7) == '\0') {
            iVar1 = *(int *)((long)pQVar5 + local_50 + -0x14);
            iVar2 = *(int *)((long)&pQVar5->stretch + local_50);
            iVar13 = (iVar11 - iVar6) + iVar2;
            if (iVar1 <= iVar13) {
              iVar13 = iVar1;
            }
            *(int *)((long)&pQVar5->stretch + local_50) = iVar13;
            iVar13 = iVar13 - iVar2;
          }
          iVar6 = iVar6 + iVar13;
          local_50 = local_50 + 0x20;
        }
      }
    }
    else {
      lVar12 = (long)index;
      piVar4 = &pQVar3->size;
      iVar7 = 0;
      for (lVar9 = 0; lVar9 <= lVar12; lVar9 = lVar9 + 1) {
        if (*(bool *)((long)piVar4 + -7) == false) {
          if (piVar4[-5] == 0x7ffff) {
            iVar7 = 0x7ffff;
            break;
          }
          iVar7 = (piVar4[-5] + iVar7) - *piVar4;
        }
        piVar4 = piVar4 + 8;
      }
      if (iVar7 < delta) {
        delta = iVar7;
      }
      lVar9 = lVar12 * 0x20 + 0x3c;
      iVar7 = 0;
      while( true ) {
        lVar12 = lVar12 + 1;
        if ((delta <= iVar7) || ((list->d).size <= lVar12)) break;
        pQVar5 = QList<QLayoutStruct>::data(list);
        iVar6 = 0;
        if (*(char *)((long)pQVar5 + lVar9 + -7) == '\0') {
          iVar11 = *(int *)((long)pQVar5 + lVar9 + -0x10);
          iVar6 = *(int *)((long)&pQVar5->stretch + lVar9);
          iVar13 = (iVar7 - delta) + iVar6;
          if (iVar13 <= iVar11) {
            iVar13 = iVar11;
          }
          *(int *)((long)&pQVar5->stretch + lVar9) = iVar13;
          iVar6 = iVar6 - iVar13;
        }
        iVar7 = iVar7 + iVar6;
        lVar9 = lVar9 + 0x20;
      }
      iVar6 = 0;
      for (; (iVar7 - iVar6 != 0 && iVar6 <= iVar7 && (-1 < (int)uVar14));
          uVar14 = (ulong)((int)uVar14 - 1)) {
        pQVar5 = QList<QLayoutStruct>::data(list);
        iVar11 = 0;
        if (pQVar5[uVar14].empty == false) {
          iVar13 = pQVar5[uVar14].size;
          iVar11 = (iVar7 - iVar6) + iVar13;
          if (pQVar5[uVar14].maximumSize <= iVar11) {
            iVar11 = pQVar5[uVar14].maximumSize;
          }
          pQVar5[uVar14].size = iVar11;
          iVar11 = iVar11 - iVar13;
        }
        iVar6 = iVar6 + iVar11;
      }
    }
    bVar10 = true;
    lVar12 = 0x1c;
    for (uVar14 = 0; uVar14 < (ulong)(list->d).size; uVar14 = uVar14 + 1) {
      pQVar5 = QList<QLayoutStruct>::data(list);
      iVar6 = sep;
      if (bVar10) {
        iVar6 = 0;
      }
      iVar6 = iVar6 + local_54;
      if (*(char *)((long)pQVar5 + lVar12 + -7) == '\0') {
        local_54 = *(int *)((long)&pQVar5->stretch + lVar12) + iVar6;
        bVar10 = false;
      }
      *(int *)((long)pQVar5 + lVar12 + -4) = iVar6;
      lVar12 = lVar12 + 0x20;
    }
  }
  return iVar7;
}

Assistant:

static int separatorMoveHelper(QList<QLayoutStruct> &list, int index, int delta, int sep)
{
    // adjust sizes
    int pos = -1;
    for (int i = 0; i < list.size(); ++i) {
        const QLayoutStruct &ls = list.at(i);
        if (!ls.empty) {
            pos = ls.pos;
            break;
        }
    }
    if (pos == -1)
        return 0;

    if (delta > 0) {
        int growlimit = 0;
        for (int i = 0; i<=index; ++i) {
            const QLayoutStruct &ls = list.at(i);
            if (ls.empty)
                continue;
            if (ls.maximumSize == QLAYOUTSIZE_MAX) {
                growlimit = QLAYOUTSIZE_MAX;
                break;
            }
            growlimit += ls.maximumSize - ls.size;
        }
        if (delta > growlimit)
            delta = growlimit;

        int d = 0;
        for (int i = index + 1; d < delta && i < list.size(); ++i)
            d += shrink(list[i], delta - d);
        delta = d;
        d = 0;
        for (int i = index; d < delta && i >= 0; --i)
            d += grow(list[i], delta - d);
    } else if (delta < 0) {
        int growlimit = 0;
        for (int i = index + 1; i < list.size(); ++i) {
            const QLayoutStruct &ls = list.at(i);
            if (ls.empty)
                continue;
            if (ls.maximumSize == QLAYOUTSIZE_MAX) {
                growlimit = QLAYOUTSIZE_MAX;
                break;
            }
            growlimit += ls.maximumSize - ls.size;
        }
        if (-delta > growlimit)
            delta = -growlimit;

        int d = 0;
        for (int i = index; d < -delta && i >= 0; --i)
            d += shrink(list[i], -delta - d);
        delta = -d;
        d = 0;
        for (int i = index + 1; d < -delta && i < list.size(); ++i)
            d += grow(list[i], -delta - d);
    }

    // adjust positions
    bool first = true;
    for (int i = 0; i < list.size(); ++i) {
        QLayoutStruct &ls = list[i];
        if (ls.empty) {
            ls.pos = pos + (first ? 0 : sep);
            continue;
        }
        if (!first)
            pos += sep;
        ls.pos = pos;
        pos += ls.size;
        first = false;
    }

    return delta;
}